

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::clear
          (ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *this)

{
  ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *this_local;
  
  this->pos = this->ptr;
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }